

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshSimplify.cpp
# Opt level: O3

void __thiscall MeshSimplify::output(MeshSimplify *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  _Self __tmp;
  long lVar5;
  VertexGroup *pVVar6;
  _Rb_tree_node_base *p_Var7;
  _Self __tmp_1;
  long lVar8;
  
  pVVar6 = this->vGroup;
  if (0 < pVVar6->cntVertex) {
    lVar8 = 0;
    lVar5 = 0x68;
    iVar4 = 0;
    do {
      if (pVVar6->isDeleted[lVar8 + 1] == false) {
        iVar4 = iVar4 + 1;
        *(int *)((long)pVVar6 + lVar5 + -0x18) = iVar4;
        printf("v %lf %lf %lf\n",*(undefined8 *)((long)pVVar6 + lVar5 + -0x10),
               *(undefined8 *)((long)pVVar6 + lVar5 + -8),
               *(undefined8 *)(&pVVar6->field_0x0 + lVar5));
        pVVar6 = this->vGroup;
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x50;
    } while (lVar8 < pVVar6->cntVertex);
    if (0 < pVVar6->cntVertex) {
      lVar5 = 1;
      do {
        if (pVVar6->isDeleted[lVar5] == false) {
          lVar8 = lVar5 * 0x50;
          p_Var7 = (_Rb_tree_node_base *)(&pVVar6->field_0x28 + lVar8);
          p_Var3 = *(_Rb_tree_node_base **)(&pVVar6->field_0x38 + lVar8);
          if (p_Var3 != p_Var7) {
            do {
              if (lVar5 < (int)p_Var3[1]._M_color) {
                for (p_Var2 = *(_Rb_tree_node_base **)((long)(&pVVar6->field_0x0 + lVar8) + 0x38);
                    p_Var2 != p_Var7; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)
                    ) {
                  if (((int)p_Var3[1]._M_color < (int)p_Var2[1]._M_color) &&
                     (bVar1 = Vertex::hasNeighborVertex
                                        ((Vertex *)
                                         (&this->vGroup->field_0x0 +
                                         (long)(int)p_Var3[1]._M_color * 0x50),p_Var2[1]._M_color),
                     bVar1)) {
                    printf("f %d %d %d\n",(ulong)*(uint *)(&pVVar6->field_0x0 + lVar8),
                           (ulong)*(uint *)(&this->vGroup->field_0x0 +
                                           (long)(int)p_Var3[1]._M_color * 0x50),
                           (ulong)*(uint *)(&this->vGroup->field_0x0 +
                                           (long)(int)p_Var2[1]._M_color * 0x50));
                  }
                }
              }
              p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
            } while (p_Var3 != p_Var7);
            pVVar6 = this->vGroup;
          }
        }
        bVar1 = lVar5 < pVVar6->cntVertex;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void MeshSimplify::output(){
	int cnt = 0;
	int cntv=0,cntf=0;
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &vGroup->group[i];
		cnt++;
		v->id = cnt;
		printf("v %lf %lf %lf\n",v->pos.x,v->pos.y,v->pos.z);
	}	
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &(vGroup->group[i]);
		for(set<int>::iterator it1 = v->neighborVertexIds.begin();it1 != v->neighborVertexIds.end();it1++){
			if(i >= (*it1))
				continue;
			for(set<int>::iterator it2 = v->neighborVertexIds.begin();it2 != v->neighborVertexIds.end();it2++){
				if((*it1) < (*it2) && (vGroup->group[(*it1)].hasNeighborVertex(*it2))){
					printf("f %d %d %d\n",v->id,vGroup->group[(*it1)].id,vGroup->group[(*it2)].id);
					cntf++;
				}	
			}
		}

	}
}